

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

void __thiscall
libtorrent::file_error_alert::file_error_alert
          (file_error_alert *this,stack_allocator *alloc,error_code *ec,string_view f,
          operation_t op_,torrent_handle *h)

{
  error_category *peVar1;
  bool bVar2;
  undefined3 uVar3;
  allocation_slot aVar4;
  char *pcVar5;
  string local_50;
  
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert =
       (_func_int **)&PTR__file_error_alert_00461878;
  bVar2 = ec->failed_;
  uVar3 = *(undefined3 *)&ec->field_0x5;
  peVar1 = ec->cat_;
  (this->error).val_ = ec->val_;
  (this->error).failed_ = bVar2;
  *(undefined3 *)&(this->error).field_0x5 = uVar3;
  (this->error).cat_ = peVar1;
  this->op = op_;
  aVar4 = aux::stack_allocator::copy_string(alloc,f);
  (this->m_file_idx).m_idx = aVar4.m_idx;
  if (op_ < (enum_route|bittorrent)) {
    pcVar5 = operation_name::names[op_];
  }
  else {
    pcVar5 = "unknown operation";
  }
  this->operation = pcVar5;
  (this->file)._M_dataplus._M_p = (pointer)&(this->file).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->file,f.ptr_,f.ptr_ + f.len_);
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&local_50,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&this->msg,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

file_error_alert::file_error_alert(aux::stack_allocator& alloc
		, error_code const& ec, string_view f, operation_t const op_
		, torrent_handle const& h)
		: torrent_alert(alloc, h)
		, error(ec)
		, op(op_)
		, m_file_idx(alloc.copy_string(f))
#if TORRENT_ABI_VERSION == 1
		, operation(operation_name(op_))
		, file(f)
		, msg(convert_from_native(error.message()))
#endif
	{}